

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void flatbuffers::SetAnyValueS(BaseType type,uint8_t *data,char *val)

{
  int *piVar1;
  int64_t val_00;
  double dVar2;
  double dVar3;
  char *endptr;
  char *local_30;
  
  local_30 = val;
  if (type - Float < 2) {
    if (val == (char *)0x0) {
      __assert_fail("str && val",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x138,
                    "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]");
    }
    dVar2 = strtod_l(val,&local_30,ClassicLocale::instance_);
    dVar3 = 0.0;
    if (((local_30 != val) && (*local_30 == '\0')) && (dVar3 = dVar2, NAN(dVar2))) {
      dVar3 = NAN;
    }
    if (type == Float) {
      *(float *)data = (float)dVar3;
    }
    else {
      *(double *)data = dVar3;
    }
  }
  else {
    if (val == (char *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    val_00 = strtoll_l(val,&local_30,10,ClassicLocale::instance_);
    if (((local_30 == val) || (*local_30 != '\0')) || (*piVar1 != 0)) {
      val_00 = 0;
    }
    SetAnyValueI(type,data,val_00);
  }
  return;
}

Assistant:

void SetAnyValueS(reflection::BaseType type, uint8_t *data, const char *val) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: {
      double d;
      StringToNumber(val, &d);
      SetAnyValueF(type, data, d);
      break;
    }
    // TODO: support strings.
    default: SetAnyValueI(type, data, StringToInt(val)); break;
  }
}